

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::LocalAppend
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,
          ColumnDataCollection *collection,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints,
          optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> column_ids)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  vector<duckdb::LogicalIndex,_true> *pvVar4;
  ColumnList *this_01;
  const_reference pvVar5;
  ColumnDefinition *pCVar6;
  string *args;
  LogicalType *pLVar7;
  mapped_type *pmVar8;
  type binder_00;
  iterator iVar9;
  ParsedExpression *pPVar10;
  DataChunk *pDVar11;
  ColumnDataCollection *pCVar12;
  PhysicalIndex physical;
  optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true> column_ids_local;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnDataChunkIterationHelper local_418;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterator __end2;
  string local_2b8;
  map<duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  active_expressions;
  ConstantBinder default_binder;
  LogicalType local_1e0;
  DataChunk result;
  ExpressionExecutor expression_executor;
  LocalAppendState append_state;
  DataTable *this_00;
  
  column_ids_local = column_ids;
  LocalAppendState::LocalAppendState(&append_state);
  iVar3 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(table);
  this_00 = (DataTable *)CONCAT44(extraout_var,iVar3);
  InitializeLocalAppend(this_00,&append_state,table,context,bound_constraints);
  if ((column_ids_local.ptr == (vector<duckdb::LogicalIndex,_true> *)0x0) ||
     (pvVar4 = optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>::operator->
                         (&column_ids_local),
     (pvVar4->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
     super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
     super__Vector_impl_data._M_start ==
     (pvVar4->super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>).
     super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    ColumnDataCollection::Chunks((ColumnDataChunkIterationHelper *)&default_binder,collection);
    ColumnDataChunkIterationHelper::begin
              (&__begin2,(ColumnDataChunkIterationHelper *)&default_binder);
    ColumnDataChunkIterationHelper::end(&__end2,(ColumnDataChunkIterationHelper *)&default_binder);
    while (bVar2 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                             (&__begin2,&__end2), bVar2) {
      pDVar11 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&__begin2);
      LocalAppend(this_00,&append_state,context,pDVar11,false);
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&__begin2);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end2);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__begin2);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &default_binder.super_ExpressionBinder.target_type);
    LocalStorage::FinalizeAppend(&append_state);
  }
  else {
    this_01 = TableCatalogEntry::GetColumns(table);
    active_expressions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &active_expressions._M_t._M_impl.super__Rb_tree_header._M_header;
    active_expressions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    active_expressions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    active_expressions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pCVar12 = (ColumnDataCollection *)0x0;
    active_expressions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         active_expressions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (__begin2.collection = pCVar12,
          pvVar4 = optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>::operator->
                             (&column_ids_local),
          pCVar12 < (ColumnDataCollection *)
                    ((long)(pvVar4->
                           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ).
                           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar4->
                           super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ).
                           super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar4 = optional_ptr<const_duckdb::vector<duckdb::LogicalIndex,_true>,_true>::operator*
                         (&column_ids_local);
      pvVar5 = vector<duckdb::LogicalIndex,_true>::get<true>(pvVar4,(size_type)__begin2.collection);
      pCVar6 = ColumnList::GetColumn(this_01,(LogicalIndex)pvVar5->index);
      args = ColumnDefinition::Name_abi_cxx11_(pCVar6);
      pLVar7 = ColumnDefinition::Type(pCVar6);
      make_uniq<duckdb::BoundReferenceExpression,std::__cxx11::string_const&,duckdb::LogicalType_const&,unsigned_long&>
                ((duckdb *)&__end2,args,pLVar7,(unsigned_long *)&__begin2);
      pCVar12 = __end2.collection;
      __end2.collection = (ColumnDataCollection *)0x0;
      default_binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)ColumnDefinition::Physical(pCVar6);
      pmVar8 = ::std::
               map<duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
               ::operator[](&active_expressions,(key_type *)&default_binder);
      _Var1._M_head_impl =
           (pmVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pmVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)pCVar12;
      if (_Var1._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
      }
      if (__end2.collection != (ColumnDataCollection *)0x0) {
        (*(code *)(((__end2.collection)->allocator).internal.
                   super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->alloc)();
      }
      pCVar12 = (ColumnDataCollection *)
                ((long)&((__begin2.collection)->allocator).internal.
                        super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 1);
    }
    Binder::CreateBinder
              ((Binder *)&binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    binder_00 = shared_ptr<duckdb::Binder,_true>::operator*(&binder);
    ::std::__cxx11::string::string((string *)&local_2b8,"DEFAULT value",(allocator *)&__begin2);
    ConstantBinder::ConstantBinder(&default_binder,binder_00,context,&local_2b8);
    ::std::__cxx11::string::~string((string *)&local_2b8);
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expressions.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (physical.index = 0;
        physical.index <
        (ulong)((long)(this_01->physical_columns).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this_01->physical_columns).
                      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3); physical.index = physical.index + 1) {
      __begin2.collection = (ColumnDataCollection *)physical.index;
      iVar9 = ::std::
              _Rb_tree<duckdb::PhysicalIndex,_std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
              ::find(&active_expressions._M_t,(key_type *)&__begin2);
      if ((_Rb_tree_header *)iVar9._M_node == &active_expressions._M_t._M_impl.super__Rb_tree_header
         ) {
        pCVar6 = ColumnList::GetColumn(this_01,physical);
        bVar2 = ColumnDefinition::HasDefaultValue(pCVar6);
        if (bVar2) {
          pPVar10 = ColumnDefinition::DefaultValue(pCVar6);
          (*(pPVar10->super_BaseExpression)._vptr_BaseExpression[0xc])
                    ((LogicalType *)&__begin2,pPVar10);
          pLVar7 = ColumnDefinition::Type(pCVar6);
          LogicalType::operator=(&default_binder.super_ExpressionBinder.target_type,pLVar7);
          ExpressionBinder::Bind
                    ((ExpressionBinder *)&__end2,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&default_binder,(LogicalType *)&__begin2,false);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&expressions,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&__end2);
          pCVar12 = __begin2.collection;
          if (__end2.collection != (ColumnDataCollection *)0x0) {
            (*(code *)(((__end2.collection)->allocator).internal.
                       super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->alloc)();
            pCVar12 = __begin2.collection;
          }
        }
        else {
          pLVar7 = ColumnDefinition::Type(pCVar6);
          LogicalType::LogicalType(&local_1e0,pLVar7);
          Value::Value((Value *)&__begin2,&local_1e0);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>
                    ((duckdb *)&__end2,(Value *)&__begin2);
          Value::~Value((Value *)&__begin2);
          LogicalType::~LogicalType(&local_1e0);
          __begin2.collection = __end2.collection;
          __end2.collection = (ColumnDataCollection *)0x0;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&expressions,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&__begin2);
          pCVar12 = __end2.collection;
          if (__begin2.collection != (ColumnDataCollection *)0x0) {
            (*(code *)(((__begin2.collection)->allocator).internal.
                       super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->alloc)();
            pCVar12 = __end2.collection;
          }
        }
        if (pCVar12 != (ColumnDataCollection *)0x0) {
          (*(code *)((pCVar12->allocator).internal.
                     super___shared_ptr<duckdb::ColumnDataAllocator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->alloc)();
        }
      }
      else {
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&expressions,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &iVar9._M_node[1]._M_parent);
      }
    }
    ExpressionExecutor::ExpressionExecutor(&expression_executor,context,&expressions);
    DataChunk::DataChunk(&result);
    TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)&__begin2,table);
    DataChunk::Initialize(&result,context,(vector<duckdb::LogicalType,_true> *)&__begin2,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&__begin2);
    ColumnDataCollection::Chunks(&local_418,collection);
    ColumnDataChunkIterationHelper::begin(&__begin2,&local_418);
    ColumnDataChunkIterationHelper::end(&__end2,&local_418);
    while (bVar2 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                             (&__begin2,&__end2), bVar2) {
      pDVar11 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&__begin2);
      ExpressionExecutor::Execute(&expression_executor,pDVar11,&result);
      LocalAppend(this_00,&append_state,context,&result,false);
      DataChunk::Reset(&result);
      ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&__begin2);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__end2);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator(&__begin2);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_418.column_ids)
    ;
    LocalStorage::FinalizeAppend(&append_state);
    DataChunk::~DataChunk(&result);
    ExpressionExecutor::~ExpressionExecutor(&expression_executor);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&expressions);
    ConstantBinder::~ConstantBinder(&default_binder);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::
    _Rb_tree<duckdb::PhysicalIndex,_std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::less<duckdb::PhysicalIndex>,_std::allocator<std::pair<const_duckdb::PhysicalIndex,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::~_Rb_tree(&active_expressions._M_t);
  }
  LocalAppendState::~LocalAppendState(&append_state);
  return;
}

Assistant:

void DataTable::LocalAppend(TableCatalogEntry &table, ClientContext &context, ColumnDataCollection &collection,
                            const vector<unique_ptr<BoundConstraint>> &bound_constraints,
                            optional_ptr<const vector<LogicalIndex>> column_ids) {

	LocalAppendState append_state;
	auto &storage = table.GetStorage();
	storage.InitializeLocalAppend(append_state, table, context, bound_constraints);

	if (!column_ids || column_ids->empty()) {
		for (auto &chunk : collection.Chunks()) {
			storage.LocalAppend(append_state, context, chunk, false);
		}
		storage.FinalizeLocalAppend(append_state);
		return;
	}

	auto &column_list = table.GetColumns();
	map<PhysicalIndex, unique_ptr<Expression>> active_expressions;
	for (idx_t i = 0; i < column_ids->size(); i++) {
		auto &col = column_list.GetColumn((*column_ids)[i]);
		auto expr = make_uniq<BoundReferenceExpression>(col.Name(), col.Type(), i);
		active_expressions[col.Physical()] = std::move(expr);
	}

	auto binder = Binder::CreateBinder(context);
	ConstantBinder default_binder(*binder, context, "DEFAULT value");
	vector<unique_ptr<Expression>> expressions;
	for (idx_t i = 0; i < column_list.PhysicalColumnCount(); i++) {
		auto expr = active_expressions.find(PhysicalIndex(i));
		if (expr != active_expressions.end()) {
			expressions.push_back(std::move(expr->second));
			continue;
		}

		auto &col = column_list.GetColumn(PhysicalIndex(i));
		if (!col.HasDefaultValue()) {
			auto null_expr = make_uniq<BoundConstantExpression>(Value(col.Type()));
			expressions.push_back(std::move(null_expr));
			continue;
		}

		auto default_copy = col.DefaultValue().Copy();
		default_binder.target_type = col.Type();
		auto bound_default = default_binder.Bind(default_copy);
		expressions.push_back(std::move(bound_default));
	}

	ExpressionExecutor expression_executor(context, expressions);
	DataChunk result;
	result.Initialize(context, table.GetTypes());

	for (auto &chunk : collection.Chunks()) {
		expression_executor.Execute(chunk, result);
		storage.LocalAppend(append_state, context, result, false);
		result.Reset();
	}
	storage.FinalizeLocalAppend(append_state);
}